

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardEffectsObserver.cpp
# Opt level: O0

void __thiscall CardEffectsObserver::update(CardEffectsObserver *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  DeckOfCards *this_00;
  const_reference pvVar4;
  reference pCVar5;
  Game *local_248;
  string local_230;
  undefined1 local_210 [8];
  Cards card;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Cards,_std::allocator<Cards>_> *__range1;
  Cards three;
  Cards two;
  undefined1 local_98 [8];
  Cards one;
  vector<Cards,_std::allocator<Cards>_> topThree;
  CardEffectsObserver *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\n****************************************************************************"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "-------------------- CARD EFFECT OBSERVER ----------------------------------"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "****************************************************************************"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (this->concreteSubject == (Subject *)0x0) {
    local_248 = (Game *)0x0;
  }
  else {
    local_248 = (Game *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Game::typeinfo,0);
  }
  this_00 = Game::getGameDeck(local_248);
  DeckOfCards::topThreeCards((vector<Cards,_std::allocator<Cards>_> *)&one.it,this_00);
  pvVar4 = std::vector<Cards,_std::allocator<Cards>_>::operator[]
                     ((vector<Cards,_std::allocator<Cards>_> *)&one.it,0);
  Cards::Cards((Cards *)local_98,pvVar4);
  pvVar4 = std::vector<Cards,_std::allocator<Cards>_>::operator[]
                     ((vector<Cards,_std::allocator<Cards>_> *)&one.it,1);
  Cards::Cards((Cards *)&three.it,pvVar4);
  pvVar4 = std::vector<Cards,_std::allocator<Cards>_>::operator[]
                     ((vector<Cards,_std::allocator<Cards>_> *)&one.it,2);
  Cards::Cards((Cards *)&__range1,pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"Card 1 : ");
  poVar3 = ::operator<<(poVar3,(Cards *)local_98);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Card 2 : ");
  poVar3 = ::operator<<(poVar3,(Cards *)&three.it);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Card 3 : ");
  poVar3 = ::operator<<(poVar3,(Cards *)&__range1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Cards,_std::allocator<Cards>_>::begin
                     ((vector<Cards,_std::allocator<Cards>_> *)&one.it);
  card.it._M_current =
       (int *)std::vector<Cards,_std::allocator<Cards>_>::end
                        ((vector<Cards,_std::allocator<Cards>_> *)&one.it);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>
                                     *)&card.it), bVar1) {
    pCVar5 = __gnu_cxx::
             __normal_iterator<const_Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::
             operator*(&__end1);
    Cards::Cards((Cards *)local_210,pCVar5);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "****************************************************************************"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"***********   The potential effect of card");
    Cards::getName_abi_cxx11_(&local_230,(Cards *)local_210);
    poVar3 = std::operator<<(poVar3,(string *)&local_230);
    poVar3 = std::operator<<(poVar3," is : **********************");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_230);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "****************************************************************************"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar2 = Cards::getId((Cards *)local_210);
    switch(iVar2) {
    case 0:
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Player will add 3 victory points IF he rolls more than 2 Ouches");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case 1:
      break;
    case 2:
      poVar3 = std::operator<<((ostream *)&std::cout,"Player will removed 1 energy cube");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case 3:
      poVar3 = std::operator<<((ostream *)&std::cout,"Player will take 4 damage");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
      break;
    case 7:
      break;
    case 8:
      break;
    case 9:
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Player will add 1 energy cube IF he is in Manhattan");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Player will add 2 victory pts");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case 0x12:
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Player will add 1 energy cube IF he is in Brooklyn");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Player will add 3 victory pts");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    Cards::~Cards((Cards *)local_210);
    __gnu_cxx::__normal_iterator<const_Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::
    operator++(&__end1);
  }
  Cards::~Cards((Cards *)&__range1);
  Cards::~Cards((Cards *)&three.it);
  Cards::~Cards((Cards *)local_98);
  std::vector<Cards,_std::allocator<Cards>_>::~vector
            ((vector<Cards,_std::allocator<Cards>_> *)&one.it);
  return;
}

Assistant:

void CardEffectsObserver::update() {

    cout << "\n****************************************************************************" << endl;

    cout << "-------------------- CARD EFFECT OBSERVER ----------------------------------" << endl;

    cout << "****************************************************************************" << endl;
    const vector<Cards> topThree =  dynamic_cast<Game*>(concreteSubject)->getGameDeck()->topThreeCards();

    Cards one = topThree[0];
    Cards two = topThree[1];
    Cards three = topThree[2];
    cout << "Card 1 : " << one << endl;
    cout << "Card 2 : " << two << endl;
    cout << "Card 3 : " << three << endl;


    for (const auto card: topThree){
        cout << "****************************************************************************" << endl;
        cout << "***********   The potential effect of card" << card.getName() << " is : **********************" << endl;
        cout << "****************************************************************************" << endl;
        switch(card.getId()){
            case 0:
                cout << "Player will add 3 victory points IF he rolls more than 2 Ouches" << endl;
                break;
            case 1:

                break;
            case 2:
                cout << "Player will removed 1 energy cube" << endl;
                break;
            case 3:
                cout << "Player will take 4 damage" << endl;
                break;
            case 4:

                break;
            case 5:

                break;
            case 6:

                break;
            case 7:

                break;
            case 8:

                break;
            case 9:
                cout << "Player will add 1 energy cube IF he is in Manhattan" << endl;
                cout << "Player will add 2 victory pts" << endl;
                break;
            case 18:
                cout << "Player will add 1 energy cube IF he is in Brooklyn" << endl;
                cout << "Player will add 3 victory pts" << endl;
                break;
        }
    }


}